

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,Request *req)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"Method: ");
  poVar1 = std::operator<<(poVar1,(string *)req);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Path: ");
  poVar1 = std::operator<<(poVar1,(string *)&req->path);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Protocol: ");
  poVar1 = std::operator<<(poVar1,(string *)&req->protocol);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Host: ");
  std::operator<<(poVar1,(string *)&req->host);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Request& req) {
    stream << "Method: "   << req.method  << std::endl
           << "Path: "     << req.path << std::endl
           << "Protocol: " << req.protocol << std::endl
           << "Host: "     << req.host;

    return stream;
}